

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitLocalGet(I64ToI32Lowering *this,LocalGet *curr)

{
  mapped_type mVar1;
  Builder *this_00;
  mapped_type *pmVar2;
  Expression *value;
  LocalSet *any;
  Block *expression;
  Block *local_58;
  undefined1 local_50 [8];
  TempVar highBits;
  
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->indexMap,&curr->index);
  mVar1 = *pmVar2;
  curr->index = mVar1;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id == 3) {
    (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    getTemp((TempVar *)local_50,this,(Type)0x2);
    if ((char)highBits.pass == '\x01') {
      __assert_fail("!moved",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
    }
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    value = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
    value->_id = LocalGetId;
    *(mapped_type *)(value + 1) = mVar1 + 1;
    (value->type).id = 2;
    any = Builder::makeLocalSet(this_00,local_50._0_4_,value);
    expression = Builder::blockify((this->builder)._M_t.
                                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                   .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                                   (Expression *)any,(Expression *)curr);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)expression);
    local_58 = expression;
    std::
    _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
              ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->highBitVars,&local_58,local_50);
    TempVar::~TempVar((TempVar *)local_50);
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    const auto mappedIndex = indexMap[curr->index];
    // Need to remap the local into the new naming scheme, regardless of
    // the type of the local.
    curr->index = mappedIndex;
    if (curr->type != Type::i64) {
      return;
    }
    curr->type = Type::i32;
    TempVar highBits = getTemp();
    LocalSet* setHighBits = builder->makeLocalSet(
      highBits, builder->makeLocalGet(mappedIndex + 1, Type::i32));
    Block* result = builder->blockify(setHighBits, curr);
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }